

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O2

void __thiscall AtomicFile::AtomicFile(AtomicFile *this,string *path)

{
  Path local_50;
  
  Path::Path(&local_50,path);
  AtomicFile(this,&local_50);
  Path::~Path(&local_50);
  return;
}

Assistant:

AtomicFile::AtomicFile (std::string path) : AtomicFile (Path (path))
{
}